

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testHash(char *name)

{
  undefined8 in_RDI;
  HashInfo *pInfo;
  HashInfo *in_stack_00000808;
  hashfunc<unsigned_int> in_stack_00000810;
  char *in_stack_ffffffffffffffb8;
  hashfunc<Blob<256>_> local_40;
  hashfunc<Blob<224>_> local_38;
  hashfunc<Blob<160>_> local_30;
  hashfunc<Blob<128>_> local_28;
  hashfunc<unsigned_long> local_20;
  hashfunc<unsigned_int> local_18;
  HashInfo *local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_10 = findHash(in_stack_ffffffffffffffb8);
  if (local_10 == (HashInfo *)0x0) {
    printf("Invalid hash \'%s\' specified\n",local_8);
  }
  else {
    g_hashUnderTest = local_10;
    if (local_10->hashbits == 0x20) {
      hashfunc<unsigned_int>::hashfunc(&local_18,local_10->hash);
      test<unsigned_int>(in_stack_00000810,in_stack_00000808);
    }
    else if (local_10->hashbits == 0x40) {
      hashfunc<unsigned_long>::hashfunc(&local_20,local_10->hash);
      test<unsigned_long>((hashfunc<unsigned_long>)in_stack_00000810.m_hash,in_stack_00000808);
    }
    else if (local_10->hashbits == 0x80) {
      hashfunc<Blob<128>_>::hashfunc(&local_28,local_10->hash);
      test<Blob<128>>((hashfunc<Blob<128>_>)in_stack_00000810.m_hash,in_stack_00000808);
    }
    else if (local_10->hashbits == 0xa0) {
      hashfunc<Blob<160>_>::hashfunc(&local_30,local_10->hash);
      test<Blob<160>>((hashfunc<Blob<160>_>)in_stack_00000810.m_hash,in_stack_00000808);
    }
    else if (local_10->hashbits == 0xe0) {
      hashfunc<Blob<224>_>::hashfunc(&local_38,local_10->hash);
      test<Blob<224>>((hashfunc<Blob<224>_>)in_stack_00000810.m_hash,in_stack_00000808);
    }
    else if (local_10->hashbits == 0x100) {
      hashfunc<Blob<256>_>::hashfunc(&local_40,local_10->hash);
      test<Blob<256>>((hashfunc<Blob<256>_>)in_stack_00000810.m_hash,in_stack_00000808);
    }
    else {
      printf("Invalid hash bit width %d for hash \'%s\'",(ulong)(uint)local_10->hashbits,
             local_10->name);
    }
  }
  return;
}

Assistant:

void testHash ( const char * name )
{
  HashInfo * pInfo = findHash(name);

  if(pInfo == NULL)
  {
    printf("Invalid hash '%s' specified\n", name);
    return;
  }
  else
  {
    g_hashUnderTest = pInfo;

    if(pInfo->hashbits == 32)
    {
      test<uint32_t>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 64)
    {
      test<uint64_t>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 128)
    {
      test<uint128_t>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 160)
    {
      test<Blob<160>>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 224)
    {
      test<Blob<224>>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 256)
    {
      test<uint256_t>( pInfo->hash, pInfo );
    }
    else
    {
      printf("Invalid hash bit width %d for hash '%s'",
             pInfo->hashbits, pInfo->name);
    }
  }
}